

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

simplex_t * __thiscall
Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::operator()
          (simplex_t *__return_storage_ptr__,
          Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *this,vertex_t n,
          dimension_t k)

{
  logic_error *this_00;
  const_reference this_01;
  const_reference pvVar1;
  dimension_t k_local;
  vertex_t n_local;
  Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *this_local;
  
  if ((char)n + -1 <= (int)this) {
    this_01 = std::
              vector<std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>,_std::allocator<std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>_>
              ::operator[]((vector<std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>,_std::allocator<std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>_>
                            *)__return_storage_ptr__,(long)(char)n);
    pvVar1 = std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::operator[]
                       (this_01,(long)(int)this);
    return *(simplex_t **)pvVar1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

simplex_t operator()(vertex_t n, dimension_t k) const {
      GUDHI_assert(n >= k - 1);
      return B[k][n];
    }